

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

t_global * __thiscall xemmai::t_time::f_library<xemmai::t_global>(t_time *this)

{
  t_global *ptVar1;
  t_time *this_local;
  
  ptVar1 = f_global();
  return ptVar1;
}

Assistant:

XEMMAI__LIBRARY__BASE(t_time, t_global, f_global())

namespace
{

double f_now()
{
#ifdef __unix__
	struct timeval t;
	gettimeofday(&t, NULL);
	return t.tv_sec + t.tv_usec / 1000000.0;
#endif
#ifdef _WIN32
	FILETIME utc;
	GetSystemTimeAsFileTime(&utc);
	ULARGE_INTEGER ui;
	ui.LowPart = utc.dwLowDateTime;
	ui.HighPart = utc.dwHighDateTime;
	return (ui.QuadPart - 116444736000000000) / 10000000.0;
#endif
}

inline intptr_t f_item(const t_tuple& a_tuple, size_t a_index)
{
	auto& a = a_tuple[a_index];
	f_check<intptr_t>(a, L"item");
	return f_as<intptr_t>(a);
}

inline double f_item_with_fraction(const t_tuple& a_tuple, size_t a_index)
{
	auto& a = a_tuple[a_index];
	if (f_is<intptr_t>(a)) return f_as<intptr_t>(a);
	f_check<double>(a, L"item");
	return f_as<double>(a);
}

const intptr_t v_epoch_days = 1969 * 365 + 1969 / 4 - 1969 / 100 + 1969 / 400;

const size_t v_month_base_days[] = {
	0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334
};

intptr_t f_month_name_to_number(const wchar_t* a_name)
{
	switch (a_name[0]) {
	case L'A':
	case L'a':
		switch (a_name[1]) {
		case L'P':
		case L'p':
			switch (a_name[2]) {
			case L'R':
			case L'r':
				return a_name[3] == L'\0' ? 4 : 0;
			default:
				return 0;
			}
		case L'U':
		case L'u':
			switch (a_name[2]) {
			case L'G':
			case L'g':
				return a_name[3] == L'\0' ? 8 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	case L'D':
	case L'd':
		switch (a_name[1]) {
		case L'E':
		case L'e':
			switch (a_name[2]) {
			case L'C':
			case L'c':
				return a_name[3] == L'\0' ? 12 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	case L'F':
	case L'f':
		switch (a_name[1]) {
		case L'E':
		case L'e':
			switch (a_name[2]) {
			case L'B':
			case L'b':
				return a_name[3] == L'\0' ? 2 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	case L'J':
	case L'j':
		switch (a_name[1]) {
		case L'A':
		case L'a':
			switch (a_name[2]) {
			case L'N':
			case L'n':
				return a_name[3] == L'\0' ? 1 : 0;
			default:
				return 0;
			}
		case L'U':
		case L'u':
			switch (a_name[2]) {
			case L'L':
			case L'l':
				return a_name[3] == L'\0' ? 7 : 0;
			case L'N':
			case L'n':
				return a_name[3] == L'\0' ? 6 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	case L'M':
	case L'm':
		switch (a_name[1]) {
		case L'A':
		case L'a':
			switch (a_name[2]) {
			case L'R':
			case L'r':
				return a_name[3] == L'\0' ? 3 : 0;
			case L'Y':
			case L'y':
				return a_name[3] == L'\0' ? 5 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	case L'N':
	case L'n':
		switch (a_name[1]) {
		case L'O':
		case L'o':
			switch (a_name[2]) {
			case L'V':
			case L'v':
				return a_name[3] == L'\0' ? 11 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	case L'O':
	case L'o':
		switch (a_name[1]) {
		case L'C':
		case L'c':
			switch (a_name[2]) {
			case L'T':
			case L't':
				return a_name[3] == L'\0' ? 10 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	case L'S':
	case L's':
		switch (a_name[1]) {
		case L'E':
		case L'e':
			switch (a_name[2]) {
			case L'P':
			case L'p':
				return a_name[3] == L'\0' ? 9 : 0;
			default:
				return 0;
			}
		default:
			return 0;
		}
	default:
		return 0;
	}
}

intptr_t f_zone_to_offset_us(const wchar_t* a_zone, intptr_t a_military, intptr_t a_us)
{
	switch (a_zone[1]) {
	case L'\0':
		return a_military * 3600;
	case L'D':
	case L'd':
		++a_us;
		break;
	case L'S':
	case L's':
		break;
	default:
		return 0;
	}
	switch (a_zone[2]) {
	case L'T':
	case L't':
		return a_zone[3] == L'\0' ? a_us * 3600 : 0;
	default:
		return 0;
	}
}

intptr_t f_zone_to_offset(const wchar_t* a_zone)
{
	switch (a_zone[0]) {
	case L'+':
	case L'-':
		if (std::iswdigit(a_zone[1]) && std::iswdigit(a_zone[2])) {
			size_t i = a_zone[3] == L':' ? 4 : 3;
			if (!std::iswdigit(a_zone[i]) || !std::iswdigit(a_zone[i + 1]) || a_zone[i + 2] != L'\0') return 0;
			intptr_t hour = (a_zone[1] - L'0') * 10 + (a_zone[2] - L'0');
			intptr_t minute = (a_zone[i] - L'0') * 10 + (a_zone[i + 1] - L'0');
			return (a_zone[0] == L'-' ? -60 : 60) * (hour * 60 + minute);
		} else {
			return 0;
		}
	case L'A':
	case L'a':
		return a_zone[1] == L'\0' ? 1 * 3600 : 0;
	case L'B':
	case L'b':
		return a_zone[1] == L'\0' ? 2 * 3600 : 0;
	case L'C':
	case L'c':
		return f_zone_to_offset_us(a_zone, 3, -6);
	case L'D':
	case L'd':
		return a_zone[1] == L'\0' ? 4 * 3600 : 0;
	case L'E':
	case L'e':
		return f_zone_to_offset_us(a_zone, 5, -5);
	case L'F':
	case L'f':
		return a_zone[1] == L'\0' ? 6 * 3600 : 0;
	case L'G':
	case L'g':
		return a_zone[1] == L'\0' ? 7 * 3600 : 0;
	case L'H':
	case L'h':
		return a_zone[1] == L'\0' ? 8 * 3600 : 0;
	case L'I':
	case L'i':
		return a_zone[1] == L'\0' ? 9 * 3600 : 0;
	case L'K':
	case L'k':
		return a_zone[1] == L'\0' ? 10 * 3600 : 0;
	case L'L':
	case L'l':
		return a_zone[1] == L'\0' ? 11 * 3600 : 0;
	case L'M':
	case L'm':
		return f_zone_to_offset_us(a_zone, 12, -7);
	case L'N':
	case L'n':
		return a_zone[1] == L'\0' ? -1 * 3600 : 0;
	case L'O':
	case L'o':
		return a_zone[1] == L'\0' ? -2 * 3600 : 0;
	case L'P':
	case L'p':
		return f_zone_to_offset_us(a_zone, -3, -8);
	case L'Q':
	case L'q':
		return a_zone[1] == L'\0' ? -4 * 3600 : 0;
	case L'R':
	case L'r':
		return a_zone[1] == L'\0' ? -5 * 3600 : 0;
	case L'S':
	case L's':
		return a_zone[1] == L'\0' ? -6 * 3600 : 0;
	case L'T':
	case L't':
		return a_zone[1] == L'\0' ? -7 * 3600 : 0;
	case L'U':
	case L'u':
		return a_zone[1] == L'\0' ? -8 * 3600 : 0;
	case L'V':
	case L'v':
		return a_zone[1] == L'\0' ? -9 * 3600 : 0;
	case L'W':
	case L'w':
		return a_zone[1] == L'\0' ? -10 * 3600 : 0;
	case L'X':
	case L'x':
		return a_zone[1] == L'\0' ? -11 * 3600 : 0;
	case L'Y':
	case L'y':
		return a_zone[1] == L'\0' ? -12 * 3600 : 0;
	default:
		return 0;
	}
}

const wchar_t* v_rfc2822_days[] = {
	L"Sun", L"Mon", L"Tue", L"Wed", L"Thu", L"Fri", L"Sat"
};

const wchar_t* v_rfc2822_months[] = {
	L"Jan", L"Feb", L"Mar", L"Apr", L"May", L"Jun",
	L"Jul", L"Aug", L"Sep", L"Oct", L"Nov", L"Dec"
};

}